

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

bool __thiscall
cmFindLibraryHelper::CheckDirectoryForName(cmFindLibraryHelper *this,string *path,Name *name)

{
  string *psVar1;
  string *filename;
  size_type sVar2;
  bool bVar3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar4;
  size_type sVar5;
  size_type sVar6;
  _Base_ptr p_Var7;
  uint minor;
  uint major;
  uint local_b8;
  uint local_b4;
  size_type local_b0;
  size_type local_a8;
  RegularExpression *local_a0;
  string *local_98;
  string *local_90;
  string *local_88;
  cmFindLibraryHelper *local_80;
  string dir;
  string local_50;
  
  if (name->TryRaw == true) {
    psVar1 = &name->Raw;
    cmStrCat<std::__cxx11::string_const&,std::__cxx11::string&>(&dir,path,psVar1);
    filename = &this->TestPath;
    std::__cxx11::string::operator=((string *)filename,(string *)&dir);
    std::__cxx11::string::~string((string *)&dir);
    bVar3 = cmsys::SystemTools::FileExists(filename,true);
    if (bVar3) {
      cmsys::SystemTools::CollapseFullPath(&dir,filename);
      bVar3 = Validate(this,&dir);
      if (bVar3) {
        DebugLibraryFound(this,psVar1,path);
        std::__cxx11::string::_M_assign((string *)&this->BestPath);
      }
      else {
        DebugLibraryFailed(this,psVar1,path);
      }
      std::__cxx11::string::~string((string *)&dir);
      if (bVar3) {
        return true;
      }
    }
    else {
      DebugLibraryFailed(this,psVar1,path);
    }
  }
  local_a8 = (long)(this->Prefixes).Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Prefixes).Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_b0 = (long)(this->Suffixes).Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Suffixes).Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&dir,(string *)path);
  cmsys::SystemTools::ConvertToUnixSlashes(&dir);
  psVar4 = cmGlobalGenerator::GetDirectoryContent(this->GG,&dir,true);
  local_a8 = (long)local_a8 >> 5;
  local_b0 = (long)local_b0 >> 5;
  p_Var7 = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a0 = &name->Regex;
  local_90 = &this->TestPath;
  local_98 = &name->Raw;
  local_88 = &this->BestPath;
  local_b4 = 0;
  local_b8 = 0;
  local_80 = this;
  for (; (_Rb_tree_header *)p_Var7 != &(psVar4->_M_t)._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    bVar3 = cmsys::RegularExpression::find(local_a0,(string *)(p_Var7 + 1));
    if (bVar3) {
      cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&>
                (&local_50,path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var7 + 1));
      psVar1 = local_90;
      std::__cxx11::string::operator=((string *)local_90,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar3 = cmsys::SystemTools::FileExists(psVar1,true);
      if (bVar3) {
        cmsys::SystemTools::CollapseFullPath(&local_50,local_90);
        bVar3 = Validate(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar3) {
          DebugLibraryFound(this,local_98,&dir);
          cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_50,&local_a0->regmatch,1);
          sVar5 = GetPrefixIndex(this,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_50,&local_a0->regmatch,2);
          sVar6 = GetSuffixIndex(this,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          major = 0;
          minor = 0;
          if (this->IsOpenBSD == true) {
            cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_50,&local_a0->regmatch,3);
            __isoc99_sscanf(local_50._M_dataplus._M_p,".%u.%u",&major,&minor);
            std::__cxx11::string::~string((string *)&local_50);
          }
          if (((((local_80->BestPath)._M_string_length == 0) || (sVar5 < local_a8)) ||
              ((sVar5 == local_a8 && (sVar6 < local_b0)))) ||
             (((this = local_80, sVar5 == local_a8 && (sVar6 == local_b0)) &&
              ((local_b4 < major || ((major == local_b4 && (local_b8 < minor)))))))) {
            std::__cxx11::string::_M_assign((string *)local_88);
            local_b4 = major;
            local_b8 = minor;
            this = local_80;
            local_b0 = sVar6;
            local_a8 = sVar5;
          }
        }
      }
    }
  }
  if ((this->BestPath)._M_string_length == 0) {
    DebugLibraryFailed(this,local_98,&dir);
  }
  else {
    DebugLibraryFound(this,local_98,local_88);
  }
  sVar2 = (this->BestPath)._M_string_length;
  std::__cxx11::string::~string((string *)&dir);
  return sVar2 != 0;
}

Assistant:

bool cmFindLibraryHelper::CheckDirectoryForName(std::string const& path,
                                                Name& name)
{
  // If the original library name provided by the user matches one of
  // the suffixes, try it first.  This allows users to search
  // specifically for a static library on some platforms (on MS tools
  // one cannot tell just from the library name whether it is a static
  // library or an import library).
  if (name.TryRaw) {
    this->TestPath = cmStrCat(path, name.Raw);

    const bool exists = cmSystemTools::FileExists(this->TestPath, true);
    if (!exists) {
      this->DebugLibraryFailed(name.Raw, path);
    } else {
      auto testPath = cmSystemTools::CollapseFullPath(this->TestPath);
      if (this->Validate(testPath)) {
        this->DebugLibraryFound(name.Raw, path);
        this->BestPath = testPath;
        return true;
      }
      this->DebugLibraryFailed(name.Raw, path);
    }
  }

  // No library file has yet been found.
  size_type bestPrefix = this->Prefixes.size();
  size_type bestSuffix = this->Suffixes.size();
  unsigned int bestMajor = 0;
  unsigned int bestMinor = 0;

  // Search for a file matching the library name regex.
  std::string dir = path;
  cmSystemTools::ConvertToUnixSlashes(dir);
  std::set<std::string> const& files = this->GG->GetDirectoryContent(dir);
  for (std::string const& origName : files) {
#if defined(_WIN32) || defined(__APPLE__)
    std::string testName = cmSystemTools::LowerCase(origName);
#else
    std::string const& testName = origName;
#endif
    if (name.Regex.find(testName)) {
      this->TestPath = cmStrCat(path, origName);
      // Make sure the path is readable and is not a directory.
      if (cmSystemTools::FileExists(this->TestPath, true)) {
        if (!this->Validate(cmSystemTools::CollapseFullPath(this->TestPath))) {
          continue;
        }

        this->DebugLibraryFound(name.Raw, dir);
        // This is a matching file.  Check if it is better than the
        // best name found so far.  Earlier prefixes are preferred,
        // followed by earlier suffixes.  For OpenBSD, shared library
        // version extensions are compared.
        size_type prefix = this->GetPrefixIndex(name.Regex.match(1));
        size_type suffix = this->GetSuffixIndex(name.Regex.match(2));
        unsigned int major = 0;
        unsigned int minor = 0;
        if (this->IsOpenBSD) {
          sscanf(name.Regex.match(3).c_str(), ".%u.%u", &major, &minor);
        }
        if (this->BestPath.empty() || prefix < bestPrefix ||
            (prefix == bestPrefix && suffix < bestSuffix) ||
            (prefix == bestPrefix && suffix == bestSuffix &&
             (major > bestMajor ||
              (major == bestMajor && minor > bestMinor)))) {
          this->BestPath = this->TestPath;
          bestPrefix = prefix;
          bestSuffix = suffix;
          bestMajor = major;
          bestMinor = minor;
        }
      }
    }
  }

  if (this->BestPath.empty()) {
    this->DebugLibraryFailed(name.Raw, dir);
  } else {
    this->DebugLibraryFound(name.Raw, this->BestPath);
  }

  // Use the best candidate found in this directory, if any.
  return !this->BestPath.empty();
}